

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Deserializer.cpp
# Opt level: O2

void __thiscall adios2::format::BP5Deserializer::~BP5Deserializer(BP5Deserializer *this,void **vtt)

{
  ControlInfo *pCVar1;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *p_Var2;
  IO *this_00;
  StructDefinition *this_01;
  _Vector_base<void_*,_std::allocator<void_*>_> *p_Var3;
  pointer ppvVar4;
  pointer pvVar5;
  pointer ppuVar6;
  unsigned_long **p;
  __node_base *p_Var7;
  pointer ppuVar8;
  vector<void_*,_std::allocator<void_*>_> **step;
  BP5VarRec *this_02;
  pointer ppvVar9;
  pointer pvVar10;
  ControlInfo *__ptr;
  allocator local_59;
  vector<std::vector<void_*,_std::allocator<void_*>_>_*,_std::allocator<std::vector<void_*,_std::allocator<void_*>_>_*>_>
  *local_58;
  string local_50;
  
  this->_vptr_BP5Deserializer = (_func_int **)*vtt;
  __ptr = this->ControlBlocks;
  free_FFSContext(this->ReaderFFSContext);
  this->ControlBlocks = (ControlInfo *)0x0;
  while (__ptr != (ControlInfo *)0x0) {
    pCVar1 = __ptr->Next;
    p_Var2 = &__ptr->MetaFieldOffset->
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>;
    if (p_Var2 != (_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)0x0) {
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(p_Var2);
    }
    operator_delete(p_Var2);
    p_Var2 = &__ptr->CIVarIndex->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>;
    if (p_Var2 != (_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)0x0) {
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(p_Var2);
    }
    operator_delete(p_Var2);
    free(__ptr);
    __ptr = pCVar1;
  }
  p_Var7 = &(this->VarByName)._M_h._M_before_begin;
  do {
    p_Var7 = p_Var7->_M_nxt;
    if (p_Var7 == (__node_base *)0x0) {
      p_Var3 = &this->m_FreeableMBA->super__Vector_base<void_*,_std::allocator<void_*>_>;
      if (p_Var3 != (_Vector_base<void_*,_std::allocator<void_*>_> *)0x0) {
        std::_Vector_base<void_*,_std::allocator<void_*>_>::~_Vector_base(p_Var3);
        operator_delete(p_Var3);
      }
      local_58 = &this->MetadataBaseArray;
      ppvVar4 = (this->MetadataBaseArray).
                super__Vector_base<std::vector<void_*,_std::allocator<void_*>_>_*,_std::allocator<std::vector<void_*,_std::allocator<void_*>_>_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (ppvVar9 = (this->MetadataBaseArray).
                     super__Vector_base<std::vector<void_*,_std::allocator<void_*>_>_*,_std::allocator<std::vector<void_*,_std::allocator<void_*>_>_*>_>
                     ._M_impl.super__Vector_impl_data._M_start; ppvVar9 != ppvVar4;
          ppvVar9 = ppvVar9 + 1) {
        p_Var3 = &(*ppvVar9)->super__Vector_base<void_*,_std::allocator<void_*>_>;
        if (p_Var3 != (_Vector_base<void_*,_std::allocator<void_*>_> *)0x0) {
          std::_Vector_base<void_*,_std::allocator<void_*>_>::~_Vector_base(p_Var3);
        }
        operator_delete(p_Var3);
      }
      pvVar5 = (this->JoinedDimArray).
               super__Vector_base<std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>,_std::allocator<std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pvVar10 = (this->JoinedDimArray).
                     super__Vector_base<std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>,_std::allocator<std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; pvVar10 != pvVar5;
          pvVar10 = pvVar10 + 1) {
        ppuVar6 = (pvVar10->super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>).
                  _M_impl.super__Vector_impl_data._M_finish;
        for (ppuVar8 = (pvVar10->
                       super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>).
                       _M_impl.super__Vector_impl_data._M_start; ppuVar8 != ppuVar6;
            ppuVar8 = ppuVar8 + 1) {
          free(*ppuVar8);
        }
      }
      std::
      vector<std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>,_std::allocator<std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>_>_>
      ::~vector(&this->JoinedDimArray);
      std::
      _Vector_base<std::vector<void_*,_std::allocator<void_*>_>_*,_std::allocator<std::vector<void_*,_std::allocator<void_*>_>_*>_>
      ::~_Vector_base(&local_58->
                       super__Vector_base<std::vector<void_*,_std::allocator<void_*>_>_*,_std::allocator<std::vector<void_*,_std::allocator<void_*>_>_*>_>
                     );
      std::
      vector<std::vector<adios2::format::BP5Deserializer::ControlInfo_*,_std::allocator<adios2::format::BP5Deserializer::ControlInfo_*>_>,_std::allocator<std::vector<adios2::format::BP5Deserializer::ControlInfo_*,_std::allocator<adios2::format::BP5Deserializer::ControlInfo_*>_>_>_>
      ::~vector(&this->m_ControlArray);
      std::
      _Hashtable<void_*,_std::pair<void_*const,_adios2::format::BP5Deserializer::BP5VarRec_*>,_std::allocator<std::pair<void_*const,_adios2::format::BP5Deserializer::BP5VarRec_*>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&(this->VarByKey)._M_h);
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::format::BP5Deserializer::BP5VarRec_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::format::BP5Deserializer::BP5VarRec_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&(this->VarByName)._M_h);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                (&(this->m_WriterCohortSize).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
      std::
      vector<adios2::format::BP5Deserializer::BP5ArrayRequest,_std::allocator<adios2::format::BP5Deserializer::BP5ArrayRequest>_>
      ::~vector(&this->PendingGetRequests);
      return;
    }
    this_00 = this->m_Engine->m_IO;
    std::__cxx11::string::string((string *)&local_50,(char *)p_Var7[5]._M_nxt[3]._M_nxt,&local_59);
    core::IO::RemoveVariable(this_00,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    free(p_Var7[5]._M_nxt[3]._M_nxt);
    free(p_Var7[5]._M_nxt[9]._M_nxt);
    free(p_Var7[5]._M_nxt[0xd]._M_nxt);
    this_02 = (BP5VarRec *)p_Var7[5]._M_nxt;
    this_01 = this_02->Def;
    if (this_01 == (StructDefinition *)0x0) {
LAB_005dcc97:
      BP5VarRec::~BP5VarRec(this_02);
    }
    else {
      core::StructDefinition::~StructDefinition(this_01);
      operator_delete(this_01);
      this_02 = (BP5VarRec *)p_Var7[5]._M_nxt;
      if (this_02 != (BP5VarRec *)0x0) goto LAB_005dcc97;
      this_02 = (BP5VarRec *)0x0;
    }
    operator_delete(this_02);
  } while( true );
}

Assistant:

BP5Deserializer::~BP5Deserializer()
{
    struct ControlInfo *tmp = ControlBlocks;
    free_FFSContext(ReaderFFSContext);
    ControlBlocks = NULL;
    while (tmp)
    {
        struct ControlInfo *next = tmp->Next;
        delete tmp->MetaFieldOffset;
        delete tmp->CIVarIndex;
        free(tmp);
        tmp = next;
    }
    for (auto &VarRec : VarByName)
    {
        /* remove any variables that we've created from our IO */
        m_Engine->m_IO.RemoveVariable(VarRec.second->VarName);
#ifdef ADIOS2_HAVE_DERIVED_VARIABLE
        m_Engine->m_IO.RemoveDerivedVariable(VarRec.second->VarName);
#endif

        free(VarRec.second->VarName);
        if (VarRec.second->ExprStr)
            free(VarRec.second->ExprStr);
        if (VarRec.second->Operator)
            free(VarRec.second->Operator);
        if (VarRec.second->Def)
            delete VarRec.second->Def;
        delete VarRec.second;
    }
    if (m_FreeableMBA)
    {
        delete m_FreeableMBA;
    }
    for (auto &step : MetadataBaseArray)
    {
        delete step;
    }
    for (auto &pvec : JoinedDimArray)
    {
        for (auto &p : pvec)
        {
            if (p)
            {
                free(p);
            }
        }
    }
}